

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

bool pbrt::upgradeRGBToScale(ParameterDictionary *dict,char *name,Float *totalScale)

{
  float fVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  RGB *__s;
  RGB *pRVar3;
  float *in_RDX;
  ParameterDictionary *in_RSI;
  string *in_RDI;
  optional<pbrt::RGB> rgb;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffea0;
  RGB *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  float fVar4;
  char *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  ParameterDictionary *in_stack_fffffffffffffef0;
  Allocator in_stack_fffffffffffffef8;
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [36];
  optional local_8c [16];
  undefined4 local_7c;
  allocator<char> local_59;
  string local_58 [56];
  float *local_20;
  ParameterDictionary *local_18;
  string *local_10;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator(in_stack_fffffffffffffea0);
  ParameterDictionary::GetSpectrumArray
            (in_stack_fffffffffffffef0,
             (string *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             (SpectrumType)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::empty
                    ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
                     in_stack_fffffffffffffeb0);
  if (bVar2) {
    local_1 = 1;
    local_7c = 1;
    goto LAB_0044c347;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  ParameterDictionary::GetOneRGB
            ((ParameterDictionary *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  bVar2 = pstd::optional::operator_cast_to_bool(local_8c);
  if (bVar2) {
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           pstd::optional<pbrt::RGB>::operator->((optional<pbrt::RGB> *)0x44c126);
    fVar4 = *(float *)this;
    __s = pstd::optional<pbrt::RGB>::operator->((optional<pbrt::RGB> *)0x44c149);
    if ((fVar4 != __s->g) || (NAN(fVar4) || NAN(__s->g))) goto LAB_0044c1b2;
    pRVar3 = pstd::optional<pbrt::RGB>::operator->((optional<pbrt::RGB> *)0x44c171);
    fVar1 = pRVar3->g;
    pRVar3 = pstd::optional<pbrt::RGB>::operator->((optional<pbrt::RGB> *)0x44c195);
    if ((fVar1 != pRVar3->b) || (NAN(fVar1) || NAN(pRVar3->b))) goto LAB_0044c1b2;
    in_stack_fffffffffffffeb0 =
         pstd::optional<pbrt::RGB>::operator->((optional<pbrt::RGB> *)0x44c239);
    *local_20 = *local_20 * in_stack_fffffffffffffeb0->r;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)__s,(allocator<char> *)CONCAT44(fVar4,in_stack_fffffffffffffed0));
    ParameterDictionary::RemoveSpectrum(local_18,local_10);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    local_1 = 1;
  }
  else {
LAB_0044c1b2:
    local_1 = 0;
  }
  local_7c = 1;
  pstd::optional<pbrt::RGB>::~optional((optional<pbrt::RGB> *)0x44c336);
LAB_0044c347:
  std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::~vector
            ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)
             in_stack_fffffffffffffeb0);
  return (bool)(local_1 & 1);
}

Assistant:

static bool upgradeRGBToScale(ParameterDictionary *dict, const char *name,
                              Float *totalScale) {
    std::vector<SpectrumHandle> s =
        dict->GetSpectrumArray(name, SpectrumType::General, {});
    if (s.empty())
        return true;

    pstd::optional<RGB> rgb = dict->GetOneRGB(name);
    if (!rgb || rgb->r != rgb->g || rgb->g != rgb->b)
        return false;

    *totalScale *= rgb->r;
    dict->RemoveSpectrum(name);
    return true;
}